

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

void __thiscall ON_Hatch::ON_Hatch(ON_Hatch *this,ON_Hatch *src)

{
  double dVar1;
  ON_Hatch *src_local;
  ON_Hatch *this_local;
  
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry,&src->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b6f230;
  ON_Plane::ON_Plane(&this->m_plane);
  this->m_pattern_scale = 1.0;
  this->m_pattern_rotation = 0.0;
  dVar1 = ON_2dPoint::Origin.y;
  (this->m_basepoint).x = ON_2dPoint::Origin.x;
  (this->m_basepoint).y = dVar1;
  ON_SimpleArray<ON_HatchLoop_*>::ON_SimpleArray(&this->m_loops);
  this->m_pattern_index = -1;
  Internal_CopyFrom(this,src);
  return;
}

Assistant:

ON_Hatch::ON_Hatch( const ON_Hatch& src)
  : ON_Geometry(src)
{
  Internal_CopyFrom(src);
}